

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall OPL3::~OPL3(OPL3 *this)

{
  Operator *pOVar1;
  Channel2op *pCVar2;
  Channel4op *pCVar3;
  int local_20;
  int local_1c;
  int channelNumber_1;
  int channelNumber;
  int operatorNumber;
  int array;
  OPL3 *this_local;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_009ef2b8;
  this->ryt = 0;
  setRhythmMode(this);
  for (channelNumber = 0; channelNumber < 2; channelNumber = channelNumber + 1) {
    for (channelNumber_1 = 0; channelNumber_1 < 0x20; channelNumber_1 = channelNumber_1 + 1) {
      if ((this->operators[channelNumber][channelNumber_1] != (Operator *)0x0) &&
         (pOVar1 = this->operators[channelNumber][channelNumber_1], pOVar1 != (Operator *)0x0)) {
        operator_delete(pOVar1,0xb8);
      }
    }
    for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
      pCVar2 = this->channels2op[channelNumber][local_1c];
      if (pCVar2 != (Channel2op *)0x0) {
        (*(pCVar2->super_Channel)._vptr_Channel[1])();
      }
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pCVar3 = this->channels4op[channelNumber][local_20];
      if (pCVar3 != (Channel4op *)0x0) {
        (*(pCVar3->super_Channel)._vptr_Channel[1])();
      }
    }
  }
  InstanceCount = InstanceCount + -1;
  if (InstanceCount == 0) {
    if (OPL3Data != (OPL3DataStruct *)0x0) {
      operator_delete(OPL3Data,0x547c0);
    }
    OPL3Data = (OPL3DataStruct *)0x0;
    if (OperatorData != (OperatorDataStruct *)0x0) {
      operator_delete(OperatorData,0x11c00);
    }
    OperatorData = (OperatorDataStruct *)0x0;
  }
  HighHatSnareDrumChannel::~HighHatSnareDrumChannel(&this->highHatSnareDrumChannel);
  BassDrumChannel::~BassDrumChannel(&this->bassDrumChannel);
  TomTomTopCymbalChannel::~TomTomTopCymbalChannel(&this->tomTomTopCymbalChannel);
  DisabledChannel::~DisabledChannel(&this->disabledChannel);
  OPLEmul::~OPLEmul(&this->super_OPLEmul);
  return;
}

Assistant:

OPL3::~OPL3()
{
	ryt = 0;
	setRhythmMode();	// Make sure all operators point to the dynamically allocated ones.
	for (int array = 0; array < 2; array++)
	{
		for (int operatorNumber = 0; operatorNumber < 0x20; operatorNumber++)
		{
			if (operators[array][operatorNumber] != NULL)
			{
				delete operators[array][operatorNumber];
			}
		}
		for (int channelNumber = 0; channelNumber < 9; channelNumber++)
		{
			delete channels2op[array][channelNumber];
		}
		for (int channelNumber = 0; channelNumber < 3; channelNumber++)
		{
			delete channels4op[array][channelNumber];
		}
	}
	if (--InstanceCount == 0)
	{
		delete OPL3Data;
		OPL3Data = NULL;
		delete OperatorData;
		OperatorData = NULL;
	}
}